

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySortTree.c
# Opt level: O0

int Delete(BiTree *p)

{
  BiTree pBVar1;
  BiTNode *local_28;
  BiTree s;
  BiTree q;
  BiTree *p_local;
  
  if ((*p)->rChlid == (BiTNode *)0x0) {
    pBVar1 = *p;
    *p = (*p)->lChild;
    free(pBVar1);
  }
  else if ((*p)->lChild == (BiTNode *)0x0) {
    pBVar1 = *p;
    *p = (*p)->rChlid;
    free(pBVar1);
  }
  else {
    s = *p;
    for (local_28 = (*p)->lChild; local_28->rChlid != (BiTNode *)0x0; local_28 = local_28->rChlid) {
      s = local_28;
    }
    (*p)->data = local_28->data;
    s->lChild = local_28->lChild;
    free(local_28);
  }
  return p_local._4_4_;
}

Assistant:

int Delete(BiTree *p){
      BiTree q,s;

      if((*p)->rChlid == NULL){     //右子树为空，重接他的左子树
          q = *p;
          *p = (*p)->lChild;
          free(q);
      } else if((*p)->lChild == NULL){  //左子树为空，重接他的右子树
          q = *p;
          *p = (*p)->rChlid;
          free(q);
      }else{                            //左右子树都部位空
          q = *p;
          s = (*p)->lChild;
          while(s->rChlid){             //找到左子树的最右子树
              q = s;
              s = s->rChlid;
          }

          (*p)->data = s->data;         //s指向被删除结点的直接前驱（将被删除结点的值改为直接前驱结点的值）

          q->lChild = s->lChild;    //重接q的左子树

          free(s);
      }
  }